

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

void asmjit::v1_14::JitAllocatorImpl_deleteBlock
               (JitAllocatorPrivateImpl *impl,JitAllocatorBlock *block)

{
  bool bVar1;
  uint8_t *size;
  JitAllocatorBlock *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  DualMapping *dm;
  undefined1 local_10 [8];
  undefined1 *local_8;
  
  local_8 = local_10;
  bVar1 = JitAllocatorBlock::hasFlag(in_RSI,0x10);
  if (bVar1) {
    dm = &in_RSI->_mapping;
    JitAllocatorBlock::blockSize(in_RSI);
    VirtMem::releaseDualMapping(dm,in_stack_ffffffffffffffd8);
  }
  else {
    size = JitAllocatorBlock::rxPtr(in_RSI);
    JitAllocatorBlock::blockSize(in_RSI);
    VirtMem::release(in_stack_ffffffffffffffe0,(size_t)size);
  }
  free(in_RSI);
  return;
}

Assistant:

static void JitAllocatorImpl_deleteBlock(JitAllocatorPrivateImpl* impl, JitAllocatorBlock* block) noexcept {
  DebugUtils::unused(impl);

  if (block->hasFlag(JitAllocatorBlock::kFlagDualMapped))
    VirtMem::releaseDualMapping(&block->_mapping, block->blockSize());
  else
    VirtMem::release(block->rxPtr(), block->blockSize());

  ::free(block);
}